

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall capnp::compiler::Compiler::Impl::Impl(Impl *this,AnnotationFlag annotationFlag)

{
  Workspace *this_00;
  _Rb_tree_header *p_Var1;
  Disposer *pDVar2;
  Node *pNVar3;
  WirePointer *pWVar4;
  StructDataBitCount SVar5;
  StructPointerCount SVar6;
  StructSchema SVar7;
  ushort uVar8;
  ListElementCount LVar9;
  int *piVar10;
  mapped_type *ppNVar11;
  mapped_type *pmVar12;
  CapTableReader *pCVar13;
  SegmentReader *pSVar14;
  ElementCount index;
  ElementCount index_00;
  Orphanage OVar15;
  Reader RVar16;
  Reader params;
  Which which;
  Own<capnp::compiler::Compiler::Node,_std::nullptr_t> newNode;
  StringPtr symbolName;
  Field field;
  StructSchema declSchema;
  PointerReader local_1e8;
  PointerReader local_1c8;
  undefined6 uStack_1a8;
  ElementSize EStack_1a2;
  undefined1 uStack_1a1;
  int iStack_1a0;
  undefined4 uStack_19c;
  StructReader local_190;
  Workspace *local_160;
  void *local_158;
  ListReader local_150;
  key_type local_120;
  RawBrandedSchema *local_110;
  ElementCount local_108;
  StructReader local_100;
  StructReader local_d0;
  StructSchema local_a0;
  ListReader local_98;
  FieldList local_68;
  
  (this->super_LazyLoadCallback)._vptr_LazyLoadCallback = (_func_int **)&PTR_load_0028afb8;
  this->annotationFlag = annotationFlag;
  kj::Arena::Arena(&this->nodeArena,0x400);
  (this->modules)._M_h._M_buckets = &(this->modules)._M_h._M_single_bucket;
  (this->modules)._M_h._M_bucket_count = 1;
  (this->modules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modules)._M_h._M_element_count = 0;
  (this->modules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modules)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &this->workspace;
  MallocMessageBuilder::MallocMessageBuilder(&this_00->message,0x400,GROW_HEURISTICALLY);
  OVar15 = MessageBuilder::getOrphanage((MessageBuilder *)this_00);
  (this->workspace).orphanage = OVar15;
  kj::Arena::Arena(&(this->workspace).arena,0x400);
  SchemaLoader::SchemaLoader(&(this->workspace).bootstrapLoader,&this->super_LazyLoadCallback);
  (this->nodesById)._M_h._M_buckets = &(this->nodesById)._M_h._M_single_bucket;
  (this->nodesById)._M_h._M_bucket_count = 1;
  (this->nodesById)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodesById)._M_h._M_element_count = 0;
  (this->nodesById)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodesById)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodesById)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sourceInfoById)._M_h._M_buckets = &(this->sourceInfoById)._M_h._M_single_bucket;
  (this->sourceInfoById)._M_h._M_bucket_count = 1;
  (this->sourceInfoById)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sourceInfoById)._M_h._M_element_count = 0;
  (this->sourceInfoById)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sourceInfoById)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sourceInfoById)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->builtinDecls)._M_t._M_impl.super__Rb_tree_header;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->builtinDecls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->builtinDeclsByKind)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->nextBogusId = 1000;
  local_a0.super_Schema.raw = (Schema)((long)schemas::s_96efe787c17e83bb + 0x48);
  local_160 = this_00;
  StructSchema::getFields(&local_68,&local_a0);
  if (local_68.list.reader.elementCount != 0) {
    index = 0;
    do {
      SVar7.super_Schema.raw = (Schema)(Schema)local_68.parent;
      capnp::_::ListReader::getStructElement(&local_100,&local_68.list.reader,index);
      LVar9 = local_100.nestingLimit;
      SVar6 = local_100.pointerCount;
      SVar5 = local_100.dataSize;
      pWVar4 = local_100.pointers;
      pCVar13 = local_100.capTable;
      pSVar14 = local_100.segment;
      local_110 = (RawBrandedSchema *)SVar7.super_Schema.raw;
      local_108 = index;
      if ((0x1f < local_100.dataSize) &&
         (local_158 = local_100.data, *(short *)((long)local_100.data + 2) != 0)) {
        local_1c8.capTable = local_100.capTable;
        local_1c8.pointer = local_100.pointers;
        local_1c8.segment = local_100.segment;
        local_1c8.nestingLimit = local_100.nestingLimit;
        if (local_100.pointerCount == 0) {
          local_1c8.capTable = (CapTableReader *)0x0;
          local_1c8.pointer = (WirePointer *)0x0;
          local_1c8.segment = (SegmentReader *)0x0;
          local_1c8.nestingLimit = 0x7fffffff;
        }
        RVar16 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_1c8,(void *)0x0,0);
        piVar10 = RVar16.super_StringPtr.content.ptr;
        if ((6 < RVar16.super_StringPtr.content.size_ - 1) &&
           (*(int *)((long)piVar10 + 3) == 0x6e69746c && *piVar10 == 0x6c697562)) {
          local_120.content.ptr = (char *)((long)piVar10 + 7);
          local_120.content.size_ = RVar16.super_StringPtr.content.size_ - 7;
          local_1c8.pointer = (WirePointer *)0x0;
          local_1c8.nestingLimit = 0;
          local_1c8._28_2_ = 0;
          local_1c8.segment = (SegmentReader *)0x0;
          local_1c8.capTable = (CapTableReader *)0x0;
          local_1c8._30_2_ = 0;
          uStack_1a8 = 0;
          EStack_1a2 = INLINE_COMPOSITE;
          iStack_1a0 = 0x7fffffff;
          if (SVar6 < 2) {
            LVar9 = 0x7fffffff;
            pCVar13 = (CapTableReader *)0x0;
            local_190.data = (WirePointer *)0x0;
            pSVar14 = (SegmentReader *)0x0;
          }
          else {
            local_190.data = pWVar4 + 1;
          }
          local_190.segment = pSVar14;
          local_190.capTable = pCVar13;
          local_190.pointers._0_4_ = LVar9;
          capnp::_::PointerReader::getList
                    (&local_150,(PointerReader *)&local_190,INLINE_COMPOSITE,(word *)0x0);
          LVar9 = local_150.elementCount;
          if (local_150.elementCount != 0) {
            index_00 = 0;
            do {
              capnp::_::ListReader::getStructElement(&local_190,&local_150,index_00);
              if ((0x3f < local_190.dataSize) &&
                 (*local_190.data == (WirePointer)0x94099c3f9eb32d6b)) {
                if (local_190.pointerCount == 0) {
                  local_1e8.nestingLimit = 0x7fffffff;
                  local_1e8.capTable = (CapTableReader *)0x0;
                  local_1e8.pointer = (WirePointer *)0x0;
                  local_1e8.segment = (SegmentReader *)0x0;
                }
                else {
                  local_1e8.pointer =
                       (WirePointer *)
                       CONCAT44(local_190.pointers._4_4_,(ListElementCount)local_190.pointers);
                  local_1e8.capTable = local_190.capTable;
                  local_1e8.segment = local_190.segment;
                  local_1e8.nestingLimit = local_190.nestingLimit;
                }
                capnp::_::PointerReader::getStruct(&local_d0,&local_1e8,(word *)0x0);
                local_1e8.capTable = local_d0.capTable;
                local_1e8.pointer = local_d0.pointers;
                local_1e8.segment = local_d0.segment;
                local_1e8.nestingLimit = local_d0.nestingLimit;
                if (local_d0.pointerCount == 0) {
                  local_1e8.capTable = (CapTableReader *)0x0;
                  local_1e8.pointer = (WirePointer *)0x0;
                  local_1e8.segment = (SegmentReader *)0x0;
                  local_1e8.nestingLimit = 0x7fffffff;
                }
                capnp::_::PointerReader::getList(&local_98,&local_1e8,INLINE_COMPOSITE,(word *)0x0);
                local_1c8.segment = local_98.segment;
                local_1c8.capTable = local_98.capTable;
                local_1c8.pointer = (WirePointer *)local_98.ptr;
                local_1c8.nestingLimit = local_98.elementCount;
                local_1c8._28_2_ = local_98.step._0_2_;
                local_1c8._30_2_ = local_98.step._2_2_;
                uStack_1a8 = local_98._32_6_;
                EStack_1a2 = local_98.elementSize;
                uStack_1a1 = local_98._39_1_;
                iStack_1a0 = local_98.nestingLimit;
                uStack_19c = local_98._44_4_;
                break;
              }
              index_00 = index_00 + 1;
            } while (LVar9 != index_00);
          }
          uVar8 = 0xffff;
          if (0x1f < SVar5) {
            uVar8 = ~*(ushort *)((long)local_158 + 2);
          }
          local_190.segment = (SegmentReader *)CONCAT62(local_190.segment._2_6_,uVar8);
          kj::Arena::
          allocateOwn<capnp::compiler::Compiler::Node,kj::StringPtr&,capnp::compiler::Declaration::Which&,capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                    ((Arena *)&local_150,(StringPtr *)&this->nodeArena,(Which *)&local_120,
                     (Reader *)&local_190);
          pCVar13 = local_150.capTable;
          ppNVar11 = std::
                     map<capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
                     ::operator[](&this->builtinDeclsByKind,(key_type *)&local_190);
          *ppNVar11 = (mapped_type)pCVar13;
          pmVar12 = std::
                    map<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
                    ::operator[](&this->builtinDecls,&local_120);
          pDVar2 = pmVar12->disposer;
          pNVar3 = pmVar12->ptr;
          pmVar12->disposer = (Disposer *)local_150.segment;
          pmVar12->ptr = (Node *)local_150.capTable;
          local_150.capTable = (CapTableReader *)0x0;
          if (pNVar3 != (Node *)0x0) {
            (**pDVar2->_vptr_Disposer)
                      (pDVar2,(_func_int *)
                              ((long)&(pNVar3->super_Resolver)._vptr_Resolver +
                              (long)(pNVar3->super_Resolver)._vptr_Resolver[-2]));
          }
          pCVar13 = local_150.capTable;
          if ((mapped_type)local_150.capTable != (mapped_type)0x0) {
            local_150.capTable = (CapTableReader *)0x0;
            (*(code *)(local_150.segment)->arena->_vptr_Arena)
                      (local_150.segment,
                       (_func_int *)
                       ((long)&((Resolver *)&pCVar13->_vptr_CapTableReader)->_vptr_Resolver +
                       (long)((Resolver *)&pCVar13->_vptr_CapTableReader)->_vptr_Resolver[-2]));
          }
        }
      }
      index = index + 1;
    } while (index != local_68.list.reader.elementCount);
  }
  return;
}

Assistant:

Compiler::Impl::Impl(AnnotationFlag annotationFlag)
    : annotationFlag(annotationFlag), workspace(*this) {
  // Reflectively interpret the members of Declaration.body.  Any member prefixed by "builtin"
  // defines a builtin declaration visible in the global scope.

  StructSchema declSchema = Schema::from<Declaration>();
  for (auto field: declSchema.getFields()) {
    auto fieldProto = field.getProto();
    if (fieldProto.getDiscriminantValue() != schema::Field::NO_DISCRIMINANT) {
      auto name = fieldProto.getName();
      if (name.startsWith("builtin")) {
        kj::StringPtr symbolName = name.slice(strlen("builtin"));

        List<Declaration::BrandParameter>::Reader params;
        for (auto annotation: fieldProto.getAnnotations()) {
          if (annotation.getId() == 0x94099c3f9eb32d6bull) {
            params = annotation.getValue().getList().getAs<List<Declaration::BrandParameter>>();
            break;
          }
        }

        Declaration::Which which =
            static_cast<Declaration::Which>(fieldProto.getDiscriminantValue());
        kj::Own<Node> newNode = nodeArena.allocateOwn<Node>(symbolName, which, params);
        builtinDeclsByKind[which] = newNode;
        builtinDecls[symbolName] = kj::mv(newNode);
      }
    }
  }
}